

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [64];
  string local_138 [64];
  string local_f8 [80];
  message local_a8;
  
  uVar1 = __cxa_rethrow();
  message::~message(&local_a8);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_f8);
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}